

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiID __thiscall ImGuiWindow::GetIDNoKeepAlive(ImGuiWindow *this,char *str,char *str_end)

{
  ImGuiID IVar1;
  uint *puVar2;
  size_t local_38;
  ImGuiID id;
  ImGuiID seed;
  char *str_end_local;
  char *str_local;
  ImGuiWindow *this_local;
  
  puVar2 = ImVector<unsigned_int>::back(&this->IDStack);
  if (str_end == (char *)0x0) {
    local_38 = 0;
  }
  else {
    local_38 = (long)str_end - (long)str;
  }
  IVar1 = ImHashStr(str,local_38,*puVar2);
  return IVar1;
}

Assistant:

ImGuiID ImGuiWindow::GetIDNoKeepAlive(const char* str, const char* str_end)
{
    ImGuiID seed = IDStack.back();
    ImGuiID id = ImHashStr(str, str_end ? (str_end - str) : 0, seed);
#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiContext& g = *GImGui;
    IMGUI_TEST_ENGINE_ID_INFO2(id, ImGuiDataType_String, str, str_end);
#endif
    return id;
}